

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

_Bool Curl_creader_is_paused(Curl_easy *data)

{
  _Bool _Var1;
  Curl_creader *local_20;
  Curl_creader *reader;
  Curl_easy *data_local;
  
  local_20 = (data->req).reader_stack;
  while( true ) {
    if (local_20 == (Curl_creader *)0x0) {
      return false;
    }
    _Var1 = (*local_20->crt->is_paused)(data,local_20);
    if (_Var1) break;
    local_20 = local_20->next;
  }
  return true;
}

Assistant:

bool Curl_creader_is_paused(struct Curl_easy *data)
{
  struct Curl_creader *reader = data->req.reader_stack;

  while(reader) {
    if(reader->crt->is_paused(data, reader))
      return TRUE;
    reader = reader->next;
  }
  return FALSE;
}